

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

optional<common::PSBTError> __thiscall
wallet::LegacyScriptPubKeyMan::FillPSBT
          (LegacyScriptPubKeyMan *this,PartiallySignedTransaction *psbtx,
          PrecomputedTransactionData *txdata,int sighash_type,bool sign,bool bip32derivs,
          int *n_signed,bool finalize)

{
  pointer pPVar1;
  element_type *peVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  pointer pCVar8;
  PSBTInput *input;
  ulong unaff_R15;
  long in_FS_OFFSET;
  bool bVar9;
  SigningProvider local_50;
  undefined1 local_48;
  undefined1 local_47;
  FillableSigningProvider *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (n_signed != (int *)0x0) {
    *n_signed = 0;
  }
  pCVar8 = *(pointer *)
            &(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
             super__Optional_payload<CMutableTransaction,_true,_false,_false>.
             super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
  bVar9 = *(pointer *)
           ((long)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                   super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                   super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin + 8) ==
          pCVar8;
  bVar3 = !bVar9;
  if (bVar9) {
    uVar6 = 0;
  }
  else {
    uVar7 = 1;
    uVar4 = 0;
    do {
      pPVar1 = (psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = ((long)(psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 5) *
              -0x70a3d70a3d70a3d7;
      if (uVar6 < uVar4 || uVar6 - uVar4 == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar4);
        }
        goto LAB_00218228;
      }
      input = pPVar1 + uVar4;
      bVar9 = PSBTInputSigned(input);
      if (bVar9) {
LAB_002180ef:
        bVar9 = false;
        uVar6 = unaff_R15 & 0xffffffff;
      }
      else if ((sign) &&
              ((input->sighash_type).super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_engaged == true)) {
        uVar6 = 1;
        bVar9 = true;
        if ((input->sighash_type).super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>._M_payload._M_value == sighash_type)
        goto LAB_0021803c;
      }
      else {
LAB_0021803c:
        peVar2 = (input->non_witness_utxo).
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 == (element_type *)0x0) {
          if ((input->witness_utxo).nValue != -1) goto LAB_00218082;
          uVar6 = unaff_R15 & 0xffffffff;
          bVar9 = false;
        }
        else {
          uVar6 = ((long)*(pointer *)
                          ((long)&(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                  ._M_impl.super__Vector_impl_data + 8) -
                   (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
          if (*(uint *)((long)(pCVar8 + uVar4) + 0x20) <= uVar6 &&
              uVar6 - *(uint *)((long)(pCVar8 + uVar4) + 0x20) != 0) {
LAB_00218082:
            local_50._vptr_SigningProvider = (_func_int **)&PTR__SigningProvider_006c0cb8;
            local_48 = !sign;
            local_47 = !bip32derivs;
            local_40 = &(this->super_LegacyDataSPKM).super_FillableSigningProvider;
            SignPSBTInput(&local_50,psbtx,uVar7 - 1,txdata,sighash_type,(SignatureData *)0x0,
                          finalize);
            bVar9 = PSBTInputSigned(input);
            if ((n_signed != (int *)0x0) && (bVar9 || !sign)) {
              *n_signed = *n_signed + 1;
            }
            goto LAB_002180ef;
          }
          bVar9 = true;
          uVar6 = 0;
        }
      }
      if (bVar9) break;
      uVar4 = (ulong)uVar7;
      pCVar8 = *(pointer *)
                &(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                 super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                 super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
      uVar5 = ((long)*(pointer *)
                      ((long)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                              _M_payload.
                              super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                              super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                              vin + 8) - (long)pCVar8 >> 3) * 0x4ec4ec4ec4ec4ec5;
      uVar7 = uVar7 + 1;
      bVar9 = uVar5 - uVar4 != 0;
      bVar3 = uVar4 <= uVar5 && bVar9;
      unaff_R15 = uVar6;
    } while (uVar4 <= uVar5 && bVar9);
  }
  if (bVar3) {
    uVar4 = 0x100000000;
  }
  else {
    if (*(pointer *)
         ((long)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                 super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                 super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout + 8) !=
        *(pointer *)
         &(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
          super__Optional_payload<CMutableTransaction,_true,_false,_false>.
          super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>) {
      uVar7 = 1;
      do {
        local_50._vptr_SigningProvider = (_func_int **)&PTR__SigningProvider_006c0cb8;
        local_48 = 1;
        local_47 = !bip32derivs;
        local_40 = &(this->super_LegacyDataSPKM).super_FillableSigningProvider;
        UpdatePSBTOutput(&local_50,psbtx,uVar7 - 1);
        uVar4 = (ulong)uVar7;
        uVar5 = ((long)*(pointer *)
                        ((long)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                                _M_payload.
                                super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                super__Optional_payload_base<CMutableTransaction>._M_payload.
                                _M_value.vout + 8) -
                 *(long *)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                           _M_payload.
                           super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                           super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                           vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_> >> 3) *
                -0x3333333333333333;
        uVar7 = uVar7 + 1;
      } while (uVar4 <= uVar5 && uVar5 - uVar4 != 0);
    }
    uVar4 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (optional<common::PSBTError>)(uVar4 | uVar6);
  }
LAB_00218228:
  __stack_chk_fail();
}

Assistant:

std::optional<PSBTError> LegacyScriptPubKeyMan::FillPSBT(PartiallySignedTransaction& psbtx, const PrecomputedTransactionData& txdata, int sighash_type, bool sign, bool bip32derivs, int* n_signed, bool finalize) const
{
    if (n_signed) {
        *n_signed = 0;
    }
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        const CTxIn& txin = psbtx.tx->vin[i];
        PSBTInput& input = psbtx.inputs.at(i);

        if (PSBTInputSigned(input)) {
            continue;
        }

        // Get the Sighash type
        if (sign && input.sighash_type != std::nullopt && *input.sighash_type != sighash_type) {
            return PSBTError::SIGHASH_MISMATCH;
        }

        // Check non_witness_utxo has specified prevout
        if (input.non_witness_utxo) {
            if (txin.prevout.n >= input.non_witness_utxo->vout.size()) {
                return PSBTError::MISSING_INPUTS;
            }
        } else if (input.witness_utxo.IsNull()) {
            // There's no UTXO so we can just skip this now
            continue;
        }
        SignPSBTInput(HidingSigningProvider(this, !sign, !bip32derivs), psbtx, i, &txdata, sighash_type, nullptr, finalize);

        bool signed_one = PSBTInputSigned(input);
        if (n_signed && (signed_one || !sign)) {
            // If sign is false, we assume that we _could_ sign if we get here. This
            // will never have false negatives; it is hard to tell under what i
            // circumstances it could have false positives.
            (*n_signed)++;
        }
    }

    // Fill in the bip32 keypaths and redeemscripts for the outputs so that hardware wallets can identify change
    for (unsigned int i = 0; i < psbtx.tx->vout.size(); ++i) {
        UpdatePSBTOutput(HidingSigningProvider(this, true, !bip32derivs), psbtx, i);
    }

    return {};
}